

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSampleVerifierUtil.cpp
# Opt level: O0

Vec2 __thiscall vkt::texture::util::calcLevelLodBounds(util *this,Vec2 *lodBounds,int level)

{
  Vec2 VVar1;
  float *pfVar2;
  float fVar3;
  int level_local;
  Vec2 *lodBounds_local;
  Vec2 *levelLodBounds;
  
  tcu::Vector<float,_2>::Vector((Vector<float,_2> *)this);
  pfVar2 = tcu::Vector<float,_2>::operator[](lodBounds,0);
  if (0.0 < *pfVar2) {
    pfVar2 = tcu::Vector<float,_2>::operator[](lodBounds,0);
    fVar3 = de::max<float>(*pfVar2,(float)level);
    pfVar2 = tcu::Vector<float,_2>::operator[]((Vector<float,_2> *)this,0);
    *pfVar2 = fVar3;
  }
  else {
    pfVar2 = tcu::Vector<float,_2>::operator[](lodBounds,0);
    fVar3 = *pfVar2;
    pfVar2 = tcu::Vector<float,_2>::operator[]((Vector<float,_2> *)this,0);
    *pfVar2 = fVar3;
  }
  pfVar2 = tcu::Vector<float,_2>::operator[](lodBounds,1);
  fVar3 = de::min<float>(*pfVar2,(float)level + 1.0);
  pfVar2 = tcu::Vector<float,_2>::operator[]((Vector<float,_2> *)this,1);
  *pfVar2 = fVar3;
  VVar1.m_data[1] = 0.0;
  VVar1.m_data[0] = fVar3;
  return (Vec2)VVar1.m_data;
}

Assistant:

Vec2 calcLevelLodBounds (const Vec2& lodBounds, int level)
{
	Vec2 levelLodBounds;

	if (lodBounds[0] <= 0.0f)
	{
		levelLodBounds[0] = lodBounds[0];
	}
	else
	{
		levelLodBounds[0] = de::max(lodBounds[0], (float) level);
	}

	levelLodBounds[1] = de::min(lodBounds[1], (float) level + 1.0f);

	return levelLodBounds;
}